

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxBuffer.cpp
# Opt level: O2

void __thiscall Jinx::Buffer::Read(Buffer *this,size_t *pos,void *data,size_t bytes)

{
  uint __line;
  char *__assertion;
  
  if (this->m_size - *pos < bytes) {
    __assertion = "bytes <= (m_size - *pos)";
    __line = 0x22;
  }
  else {
    if (bytes != 0) {
      memcpy(data,this->m_data + *pos,bytes);
      *pos = *pos + bytes;
      return;
    }
    __assertion = "bytesToCopy";
    __line = 0x24;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                ,__line,"void Jinx::Buffer::Read(size_t *, void *, size_t)");
}

Assistant:

inline_t void Buffer::Read(size_t * pos, void * data, size_t bytes)
	{
		assert(bytes <= (m_size - *pos));
		size_t bytesToCopy = std::min(bytes, m_size - *pos);
		assert(bytesToCopy);
		assert(bytesToCopy == bytes);
		memcpy(data, m_data + *pos, bytesToCopy);
		*pos += bytes;
	}